

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O3

void __thiscall
Rml::ElementText::GenerateGeometry
          (ElementText *this,RenderManager *render_manager,FontFaceHandle font_face_handle)

{
  undefined8 *puVar1;
  Texture *pTVar2;
  Texture *pTVar3;
  void *pvVar4;
  long lVar5;
  FontEffectsHandle FVar6;
  pointer pLVar7;
  TextureFileIndex TVar8;
  StableVectorIndex SVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  pointer pTVar12;
  int iVar13;
  ComputedValues *this_00;
  FontEngineInterface *pFVar14;
  long lVar15;
  pointer pTVar16;
  ulong uVar17;
  undefined1 local_a8 [40];
  pointer local_80;
  RenderManager *local_70;
  TexturedMeshList mesh_list;
  TextShapingContext text_shaping_context;
  StringView local_40;
  
  local_70 = render_manager;
  this_00 = Element::GetComputedValues(&this->super_Element);
  text_shaping_context.language = &(this_00->inherited).language;
  text_shaping_context.text_direction =
       (Direction)((uint)*(undefined4 *)&(this_00->inherited).field_0x14 >> 0x1d) & (Rtl|Ltr);
  text_shaping_context.letter_spacing = Style::ComputedValues::letter_spacing(this_00);
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::vector
            (&mesh_list,
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->geometry).
                   super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_a8);
  pTVar16 = (this->geometry).
            super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar16) {
    lVar15 = 0;
    uVar17 = 0;
    do {
      Geometry::Release((Mesh *)local_a8,
                        (Geometry *)
                        ((long)&(pTVar16->geometry).
                                super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                                .render_manager + lVar15),ClearMesh);
      pTVar12 = mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pvVar4 = *(void **)((long)&((mesh_list.
                                   super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices.
                                 super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar15 * 2);
      lVar5 = *(long *)((long)&((mesh_list.
                                 super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices.
                               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage + lVar15 * 2);
      puVar1 = (undefined8 *)
               ((long)&((mesh_list.
                         super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                         _M_impl.super__Vector_impl_data._M_start)->mesh).vertices.
                       super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar15 * 2);
      *puVar1 = local_a8._0_8_;
      puVar1[1] = local_a8._8_8_;
      *(undefined8 *)
       ((long)&((mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>
                 ._M_impl.super__Vector_impl_data._M_start)->mesh).vertices.
               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar15 * 2) = local_a8._16_8_;
      local_a8._0_8_ = (RenderManager *)0x0;
      local_a8._8_8_ = (pointer)0x0;
      local_a8._16_8_ = (pointer)0x0;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,lVar5 - (long)pvVar4);
      }
      pvVar4 = *(void **)((long)&(pTVar12->mesh).indices.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar15 * 2);
      lVar5 = *(long *)((long)&(pTVar12->mesh).indices.super__Vector_base<int,_std::allocator<int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar15 * 2);
      puVar1 = (undefined8 *)
               ((long)&(pTVar12->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar15 * 2);
      *puVar1 = local_a8._24_8_;
      puVar1[1] = local_a8._32_8_;
      *(pointer *)
       ((long)&(pTVar12->mesh).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar15 * 2) = local_80;
      local_a8._24_8_ = (pointer)0x0;
      local_a8._32_8_ = (_Bit_type *)0x0;
      local_80 = (pointer)0x0;
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,lVar5 - (long)pvVar4);
        if ((pointer)local_a8._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_a8._24_8_,(long)local_80 - local_a8._24_8_);
        }
      }
      if ((RenderManager *)local_a8._0_8_ != (RenderManager *)0x0) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
      }
      uVar17 = uVar17 + 1;
      pTVar16 = (this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x20;
    } while (uVar17 < (ulong)((long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar16 >> 5)
            );
  }
  if ((this->lines).
      super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->lines).
      super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar15 = 0;
    uVar17 = 0;
    do {
      pFVar14 = GetFontEngineInterface();
      FVar6 = this->font_effects_handle;
      StringView::StringView
                (&local_40,
                 (String *)
                 ((long)&(((this->lines).
                           super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                           ._M_impl.super__Vector_impl_data._M_start)->text)._M_dataplus._M_p +
                 lVar15));
      iVar13 = (*pFVar14->_vptr_FontEngineInterface[10])
                         ((int)*(undefined8 *)
                                ((long)&(((this->lines).
                                          super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->position).x +
                                lVar15),this->opacity,pFVar14,local_70,font_face_handle,FVar6,
                          local_40.p_begin,local_40.p_end,(ulong)(uint)this->colour,
                          &text_shaping_context,&mesh_list);
      pLVar7 = (this->lines).
               super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>.
               _M_impl.super__Vector_impl_data._M_start;
      *(int *)((long)&pLVar7->width + lVar15) = iVar13;
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x30;
    } while (uVar17 < (ulong)(((long)(this->lines).
                                     super__Vector_base<Rml::ElementText::Line,_std::allocator<Rml::ElementText::Line>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar7 >> 4)
                             * -0x5555555555555555));
  }
  ::std::
  vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>::
  resize(&this->geometry,
         (long)mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_start >> 6);
  if ((this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->geometry).
      super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      RenderManager::MakeGeometry((RenderManager *)local_a8,(Mesh *)local_70);
      pTVar16 = (this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar17;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)pTVar16);
      uVar10 = local_a8._0_8_;
      local_a8._0_8_ = (RenderManager *)0x0;
      (pTVar16->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .render_manager = (RenderManager *)uVar10;
      uVar11 = local_a8._8_4_;
      local_a8._8_4_ = 0xffffffff;
      (pTVar16->geometry).
      super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      .resource_handle = uVar11;
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_a8);
      pTVar2 = &mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar17].texture;
      TVar8 = pTVar2->file_index;
      SVar9 = pTVar2->callback_index;
      pTVar3 = &(this->geometry).
                super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar17].texture;
      pTVar3->render_manager = pTVar2->render_manager;
      pTVar3->file_index = TVar8;
      pTVar3->callback_index = SVar9;
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->geometry).
                                    super__Vector_base<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this->generated_decoration = None;
  this->field_0x1ec = this->field_0x1ec & 0xfe;
  ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector(&mesh_list);
  return;
}

Assistant:

void ElementText::GenerateGeometry(RenderManager& render_manager, const FontFaceHandle font_face_handle)
{
	RMLUI_ZoneScopedC(0xD2691E);

	const auto& computed = GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	// Release the old geometry, and reuse the mesh buffers.
	TexturedMeshList mesh_list(geometry.size());
	for (size_t i = 0; i < geometry.size(); i++)
		mesh_list[i].mesh = geometry[i].geometry.Release(Geometry::ReleaseMode::ClearMesh);

	// Generate the new geometry, one line at a time.
	for (size_t i = 0; i < lines.size(); ++i)
	{
		lines[i].width = GetFontEngineInterface()->GenerateString(render_manager, font_face_handle, font_effects_handle, lines[i].text,
			lines[i].position, colour, opacity, text_shaping_context, mesh_list);
	}

	// Apply the new geometry and textures.
	geometry.resize(mesh_list.size());
	for (size_t i = 0; i < geometry.size(); i++)
	{
		geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		geometry[i].texture = mesh_list[i].texture;
	}

	generated_decoration = Style::TextDecoration::None;
	geometry_dirty = false;
}